

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O0

LY_ERR lyb_print_prefix_data(ly_out *out,LY_VALUE_FORMAT format,void *prefix_data,lylyb_ctx *lybctx)

{
  LY_ERR LVar1;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  uint32_t i;
  lyxml_ns *ns;
  ly_set *set;
  lylyb_ctx *lybctx_local;
  void *prefix_data_local;
  ly_out *plStack_18;
  LY_VALUE_FORMAT format_local;
  ly_out *out_local;
  
  set = (ly_set *)lybctx;
  lybctx_local = (lylyb_ctx *)prefix_data;
  prefix_data_local._4_4_ = format;
  plStack_18 = out;
  if (format == LY_VALUE_XML) {
    ns = (lyxml_ns *)prefix_data;
    if (prefix_data == (void *)0x0) {
      ret___1 = LY_SUCCESS;
      LVar1 = lyb_write(out,(uint8_t *)&ret___1,1,lybctx);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
    }
    else {
      if (0xff < *(uint *)((long)prefix_data + 4)) {
        ly_log(lybctx->ctx,LY_LLERR,LY_EINT,"Maximum supported number of prefixes is %u.",0xff);
        return LY_EINT;
      }
      LVar1 = lyb_write_number((ulong)*(uint *)((long)prefix_data + 4),1,out,lybctx);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      for (ret___1 = LY_SUCCESS; ret___1 < *(LY_ERR *)((long)&ns->prefix + 4);
          ret___1 = ret___1 + LY_EMEM) {
        _ret__ = *(undefined8 **)(ns->uri + (ulong)ret___1 * 8);
        LVar1 = lyb_write_string((char *)*_ret__,0,'\x02',plStack_18,(lylyb_ctx *)set);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        LVar1 = lyb_write_string((char *)_ret__[1],0,'\x02',plStack_18,(lylyb_ctx *)set);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
      }
    }
  }
  else if (1 < format - LY_VALUE_JSON) {
    ly_log(lybctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_lyb.c",
           0x29f);
    return LY_EINT;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyb_print_prefix_data(struct ly_out *out, LY_VALUE_FORMAT format, const void *prefix_data, struct lylyb_ctx *lybctx)
{
    const struct ly_set *set;
    const struct lyxml_ns *ns;
    uint32_t i;

    switch (format) {
    case LY_VALUE_XML:
        set = prefix_data;
        if (!set) {
            /* no prefix data */
            i = 0;
            LY_CHECK_RET(lyb_write(out, (uint8_t *)&i, 1, lybctx));
            break;
        }
        if (set->count > UINT8_MAX) {
            LOGERR(lybctx->ctx, LY_EINT, "Maximum supported number of prefixes is %u.", UINT8_MAX);
            return LY_EINT;
        }

        /* write number of prefixes on 1 byte */
        LY_CHECK_RET(lyb_write_number(set->count, 1, out, lybctx));

        /* write all the prefixes */
        for (i = 0; i < set->count; ++i) {
            ns = set->objs[i];

            /* prefix */
            LY_CHECK_RET(lyb_write_string(ns->prefix, 0, sizeof(uint16_t), out, lybctx));

            /* namespace */
            LY_CHECK_RET(lyb_write_string(ns->uri, 0, sizeof(uint16_t), out, lybctx));
        }
        break;
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
        /* nothing to print */
        break;
    default:
        LOGINT_RET(lybctx->ctx);
    }

    return LY_SUCCESS;
}